

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

map * config_read_string(char *string,size_t size)

{
  parser *parser_00;
  map *map;
  parser *parser;
  size_t size_local;
  char *string_local;
  
  parser_00 = parser_create(string,size);
  if (parser_00 == (parser *)0x0) {
    string_local = (char *)0x0;
  }
  else {
    string_local = (char *)config_parse(parser_00);
    parser_destroy(parser_00);
    if ((map *)string_local == (map *)0x0) {
      string_local = (char *)0x0;
    }
  }
  return (map *)string_local;
}

Assistant:

struct map *config_read_string(const char *string, size_t size)
{
        struct parser *parser = parser_create(string, size);

        if (parser == NULL) {
                return NULL;
        }

        struct map *map = config_parse(parser);

        parser_destroy(parser);

        if (map == NULL) {
                return NULL;
        }

        return map;
}